

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::InitialPass
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  allocator<char> local_39;
  string e;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"must be called with at least two arguments.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&e);
LAB_001ce33f:
    std::__cxx11::string::~string((string *)&e);
    bVar1 = false;
  }
  else {
    bVar1 = std::operator==(__lhs,"WRITE");
    if (bVar1) {
      bVar1 = false;
LAB_001ce391:
      bVar1 = HandleWriteCommand(this,args,bVar1);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"APPEND");
    if (bVar1) {
      bVar1 = true;
      goto LAB_001ce391;
    }
    bVar1 = std::operator==(__lhs,"DOWNLOAD");
    if (bVar1) {
      bVar1 = HandleDownloadCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"UPLOAD");
    if (bVar1) {
      bVar1 = HandleUploadCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"READ");
    if (bVar1) {
      bVar1 = HandleReadCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"MD5");
    if (bVar1) {
LAB_001ce4de:
      bVar1 = HandleHashCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"SHA1");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA224");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA256");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA384");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA512");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA3_224");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA3_256");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA3_384");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"SHA3_512");
    if (bVar1) goto LAB_001ce4de;
    bVar1 = std::operator==(__lhs,"STRINGS");
    if (bVar1) {
      bVar1 = HandleStringsCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"GLOB");
    if (bVar1) {
      bVar1 = false;
LAB_001ce552:
      bVar1 = HandleGlobCommand(this,args,bVar1);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"GLOB_RECURSE");
    if (bVar1) {
      bVar1 = true;
      goto LAB_001ce552;
    }
    bVar1 = std::operator==(__lhs,"MAKE_DIRECTORY");
    if (bVar1) {
      bVar1 = HandleMakeDirectoryCommand(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"RENAME");
    if (bVar1) {
      bVar1 = HandleRename(this,args);
      return bVar1;
    }
    bVar1 = std::operator==(__lhs,"REMOVE");
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==(__lhs,"REMOVE_RECURSE");
      if (!bVar1) {
        bVar1 = std::operator==(__lhs,"COPY");
        if (bVar1) {
          bVar1 = HandleCopyCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"INSTALL");
        if (bVar1) {
          bVar1 = HandleInstallCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"DIFFERENT");
        if (bVar1) {
          bVar1 = HandleDifferentCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"RPATH_CHANGE");
        if (bVar1) {
LAB_001ce68e:
          bVar1 = HandleRPathChangeCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"CHRPATH");
        if (bVar1) goto LAB_001ce68e;
        bVar1 = std::operator==(__lhs,"RPATH_CHECK");
        if (bVar1) {
          bVar1 = HandleRPathCheckCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"RPATH_REMOVE");
        if (bVar1) {
          bVar1 = HandleRPathRemoveCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"READ_ELF");
        if (bVar1) {
          bVar1 = HandleReadElfCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"RELATIVE_PATH");
        if (bVar1) {
          bVar1 = HandleRelativePathCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"TO_CMAKE_PATH");
        if (bVar1) {
          bVar1 = false;
LAB_001ce777:
          bVar1 = HandleCMakePathCommand(this,args,bVar1);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"TO_NATIVE_PATH");
        if (bVar1) {
          bVar1 = true;
          goto LAB_001ce777;
        }
        bVar1 = std::operator==(__lhs,"TOUCH");
        if (bVar1) {
          bVar1 = true;
LAB_001ce7be:
          bVar1 = HandleTouchCommand(this,args,bVar1);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"TOUCH_NOCREATE");
        if (bVar1) {
          bVar1 = false;
          goto LAB_001ce7be;
        }
        bVar1 = std::operator==(__lhs,"TIMESTAMP");
        if (bVar1) {
          bVar1 = HandleTimestampCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"GENERATE");
        if (bVar1) {
          bVar1 = HandleGenerateCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"LOCK");
        if (bVar1) {
          bVar1 = HandleLockCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"SIZE");
        if (bVar1) {
          bVar1 = HandleSizeCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"READ_SYMLINK");
        if (bVar1) {
          bVar1 = HandleReadSymlinkCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"CREATE_LINK");
        if (bVar1) {
          bVar1 = HandleCreateLinkCommand(this,args);
          return bVar1;
        }
        bVar1 = std::operator==(__lhs,"GET_RUNTIME_DEPENDENCIES");
        if (bVar1) {
          bVar1 = HandleGetRuntimeDependenciesCommand(this,args);
          return bVar1;
        }
        std::operator+(&e,"does not recognize sub-command ",__lhs);
        cmCommand::SetError(&this->super_cmCommand,&e);
        goto LAB_001ce33f;
      }
      bVar1 = true;
    }
    HandleRemove(this,args,bVar1);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmFileCommand::InitialPass(std::vector<std::string> const& args,
                                cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("must be called with at least two arguments.");
    return false;
  }
  std::string const& subCommand = args[0];
  if (subCommand == "WRITE") {
    return this->HandleWriteCommand(args, false);
  }
  if (subCommand == "APPEND") {
    return this->HandleWriteCommand(args, true);
  }
  if (subCommand == "DOWNLOAD") {
    return this->HandleDownloadCommand(args);
  }
  if (subCommand == "UPLOAD") {
    return this->HandleUploadCommand(args);
  }
  if (subCommand == "READ") {
    return this->HandleReadCommand(args);
  }
  if (subCommand == "MD5" || subCommand == "SHA1" || subCommand == "SHA224" ||
      subCommand == "SHA256" || subCommand == "SHA384" ||
      subCommand == "SHA512" || subCommand == "SHA3_224" ||
      subCommand == "SHA3_256" || subCommand == "SHA3_384" ||
      subCommand == "SHA3_512") {
    return this->HandleHashCommand(args);
  }
  if (subCommand == "STRINGS") {
    return this->HandleStringsCommand(args);
  }
  if (subCommand == "GLOB") {
    return this->HandleGlobCommand(args, false);
  }
  if (subCommand == "GLOB_RECURSE") {
    return this->HandleGlobCommand(args, true);
  }
  if (subCommand == "MAKE_DIRECTORY") {
    return this->HandleMakeDirectoryCommand(args);
  }
  if (subCommand == "RENAME") {
    return this->HandleRename(args);
  }
  if (subCommand == "REMOVE") {
    return this->HandleRemove(args, false);
  }
  if (subCommand == "REMOVE_RECURSE") {
    return this->HandleRemove(args, true);
  }
  if (subCommand == "COPY") {
    return this->HandleCopyCommand(args);
  }
  if (subCommand == "INSTALL") {
    return this->HandleInstallCommand(args);
  }
  if (subCommand == "DIFFERENT") {
    return this->HandleDifferentCommand(args);
  }
  if (subCommand == "RPATH_CHANGE" || subCommand == "CHRPATH") {
    return this->HandleRPathChangeCommand(args);
  }
  if (subCommand == "RPATH_CHECK") {
    return this->HandleRPathCheckCommand(args);
  }
  if (subCommand == "RPATH_REMOVE") {
    return this->HandleRPathRemoveCommand(args);
  }
  if (subCommand == "READ_ELF") {
    return this->HandleReadElfCommand(args);
  }
  if (subCommand == "RELATIVE_PATH") {
    return this->HandleRelativePathCommand(args);
  }
  if (subCommand == "TO_CMAKE_PATH") {
    return this->HandleCMakePathCommand(args, false);
  }
  if (subCommand == "TO_NATIVE_PATH") {
    return this->HandleCMakePathCommand(args, true);
  }
  if (subCommand == "TOUCH") {
    return this->HandleTouchCommand(args, true);
  }
  if (subCommand == "TOUCH_NOCREATE") {
    return this->HandleTouchCommand(args, false);
  }
  if (subCommand == "TIMESTAMP") {
    return this->HandleTimestampCommand(args);
  }
  if (subCommand == "GENERATE") {
    return this->HandleGenerateCommand(args);
  }
  if (subCommand == "LOCK") {
    return this->HandleLockCommand(args);
  }
  if (subCommand == "SIZE") {
    return this->HandleSizeCommand(args);
  }
  if (subCommand == "READ_SYMLINK") {
    return this->HandleReadSymlinkCommand(args);
  }
  if (subCommand == "CREATE_LINK") {
    return this->HandleCreateLinkCommand(args);
  }
  if (subCommand == "GET_RUNTIME_DEPENDENCIES") {
    return this->HandleGetRuntimeDependenciesCommand(args);
  }

  std::string e = "does not recognize sub-command " + subCommand;
  this->SetError(e);
  return false;
}